

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O1

string_t __thiscall
duckdb::CaseConvertOperatorASCII<true>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperatorASCII<true> *this,string_t input,Vector *result)

{
  ulong uVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined1 local_38 [16];
  undefined8 local_28;
  long local_20;
  
  local_20 = input.value._0_8_;
  lVar3 = local_20;
  if ((Vector *)((ulong)this & 0xffffffff) < (Vector *)0xd) {
    lVar3 = (long)&local_28 + 4;
  }
  local_28 = this;
  local_38 = (undefined1  [16])
             StringVector::EmptyString
                       (input.value._8_8_,(Vector *)((ulong)this & 0xffffffff),
                        (idx_t)input.value._8_8_);
  puVar2 = (undefined4 *)local_38._8_8_;
  if ((uint)local_38._0_4_ < 0xd) {
    puVar2 = (undefined4 *)(local_38 + 4);
  }
  if (((ulong)this & 0xffffffff) != 0) {
    uVar1 = 0;
    do {
      *(undefined1 *)((long)puVar2 + uVar1) =
           (&StringUtil::ASCII_TO_UPPER_MAP)[*(byte *)(lVar3 + uVar1)];
      uVar1 = uVar1 + 1;
    } while (((ulong)this & 0xffffffff) != uVar1);
  }
  uVar1 = (ulong)(uint)local_38._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default((void *)((long)(local_38 + 4) + uVar1),0,0xc - uVar1);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return ASCIICaseConvert<IS_UPPER>(result, input_data, input_length);
	}